

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O0

void __thiscall
ExprVisitorTest_VisitPLTerm_Test::~ExprVisitorTest_VisitPLTerm_Test
          (ExprVisitorTest_VisitPLTerm_Test *this)

{
  void *in_RDI;
  
  ~ExprVisitorTest_VisitPLTerm_Test((ExprVisitorTest_VisitPLTerm_Test *)0x163258);
  operator_delete(in_RDI,0x1cd0);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitPLTerm) {
  auto builder = factory_.BeginPLTerm(1);
  builder.AddSlope(-1);
  builder.AddBreakpoint(0);
  builder.AddSlope(1);
  auto e = factory_.EndPLTerm(builder, var_);
  EXPECT_CALL(visitor_, VisitPLTerm(e));
  mp::NumericExpr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED_NUMERIC(base);
}